

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O0

void __thiscall DbCheckPostLower::Check(DbCheckPostLower *this,RegOpnd *regOpnd)

{
  code *pcVar1;
  RegNum reg_00;
  IRType IVar2;
  bool bVar3;
  byte bVar4;
  IRType type;
  int iVar5;
  undefined4 *puVar6;
  Sym *pSVar7;
  StackSym *this_00;
  IRType tyReg;
  IRType tySym;
  StackSym *sym;
  RegNum reg;
  RegOpnd *regOpnd_local;
  DbCheckPostLower *this_local;
  
  if (regOpnd != (RegOpnd *)0x0) {
    reg_00 = IR::RegOpnd::GetReg(regOpnd);
    if (reg_00 != RegNOREG) {
      IVar2 = LinearScan::GetRegType(reg_00);
      bVar3 = IRType_IsFloat(IVar2);
      if (bVar3) {
        IVar2 = IR::Opnd::GetType(&regOpnd->super_Opnd);
        bVar3 = IRType_IsFloat(IVar2);
        if (!bVar3) {
          IVar2 = IR::Opnd::GetType(&regOpnd->super_Opnd);
          bVar3 = IRType_IsSimd128(IVar2);
          if (!bVar3) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                               ,0x101,
                               "(IRType_IsFloat(regOpnd->GetType()) || IRType_IsSimd128(regOpnd->GetType()))"
                               ,
                               "IRType_IsFloat(regOpnd->GetType()) || IRType_IsSimd128(regOpnd->GetType())"
                              );
            if (!bVar3) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
        }
      }
      else {
        IVar2 = IR::Opnd::GetType(&regOpnd->super_Opnd);
        bVar3 = IRType_IsNativeInt(IVar2);
        if ((!bVar3) && (IVar2 = IR::Opnd::GetType(&regOpnd->super_Opnd), IVar2 != TyVar)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0x105,
                             "(IRType_IsNativeInt(regOpnd->GetType()) || regOpnd->GetType() == TyVar)"
                             ,
                             "IRType_IsNativeInt(regOpnd->GetType()) || regOpnd->GetType() == TyVar"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        iVar5 = IR::Opnd::GetSize(&regOpnd->super_Opnd);
        if ((iVar5 == 1) && (bVar4 = LinearScan::GetRegAttribs(reg_00), (bVar4 & 8) == 0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0x109,"(LinearScan::GetRegAttribs(reg) & 0x8)",
                             "LinearScan::GetRegAttribs(reg) & RA_BYTEABLE");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
    pSVar7 = IR::Opnd::GetSym(&regOpnd->super_Opnd);
    if (pSVar7 != (Sym *)0x0) {
      pSVar7 = IR::Opnd::GetSym(&regOpnd->super_Opnd);
      this_00 = Sym::AsStackSym(pSVar7);
      IVar2 = StackSym::GetType(this_00);
      type = IR::Opnd::GetType(&regOpnd->super_Opnd);
      bVar3 = IRType_IsSimd(IVar2);
      if (!bVar3) {
        bVar3 = IRType_IsNativeIntOrVar(IVar2);
        if (((!bVar3) || (bVar3 = IRType_IsNativeIntOrVar(type), !bVar3)) &&
           ((bVar3 = IRType_IsFloat(IVar2), !bVar3 || (bVar3 = IRType_IsFloat(type), !bVar3)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0x118,
                             "((IRType_IsNativeIntOrVar(tySym) && IRType_IsNativeIntOrVar(tyReg)) || (IRType_IsFloat(tySym) && IRType_IsFloat(tyReg)))"
                             ,
                             "(IRType_IsNativeIntOrVar(tySym) && IRType_IsNativeIntOrVar(tyReg)) || (IRType_IsFloat(tySym) && IRType_IsFloat(tyReg))"
                            );
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        if ((TySize[IVar2] < TySize[type]) && ((*(uint *)&this->func->field_0x240 >> 0x16 & 1) == 0)
           ) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0x11a,"(TySize[tySym] >= TySize[tyReg] || this->func->isPostRegAlloc)"
                             ,"TySize[tySym] >= TySize[tyReg] || this->func->isPostRegAlloc");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
      }
    }
  }
  return;
}

Assistant:

void DbCheckPostLower::Check(IR::RegOpnd *regOpnd)
{
    if (regOpnd == NULL)
    {
        return;
    }

    RegNum reg = regOpnd->GetReg();
    if (reg != RegNOREG)
    {
        if (IRType_IsFloat(LinearScan::GetRegType(reg)))
        {
            // both simd128 and float64 map to float64 regs
            Assert(IRType_IsFloat(regOpnd->GetType()) || IRType_IsSimd128(regOpnd->GetType()));
        }
        else
        {
            Assert(IRType_IsNativeInt(regOpnd->GetType()) || regOpnd->GetType() == TyVar);
#if defined(_M_IX86) || defined(_M_X64)
            if (regOpnd->GetSize() == 1)
            {
                Assert(LinearScan::GetRegAttribs(reg) & RA_BYTEABLE);
            }
#endif
        }
    }

    if (regOpnd->GetSym())
    {
        StackSym *sym = regOpnd->GetSym()->AsStackSym();
        IRType tySym = sym->GetType();
        IRType tyReg = regOpnd->GetType();

        if (!IRType_IsSimd(tySym))
        {
            Assert((IRType_IsNativeIntOrVar(tySym) && IRType_IsNativeIntOrVar(tyReg))
                || (IRType_IsFloat(tySym) && IRType_IsFloat(tyReg)));

            Assert(TySize[tySym] >= TySize[tyReg] || this->func->isPostRegAlloc);
        }
    }
}